

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int find_param(VARR_token_t *params,char *name)

{
  int iVar1;
  size_t sVar2;
  token_t ptVar3;
  size_t i;
  size_t ix;
  
  sVar2 = VARR_token_tlength(params);
  iVar1 = strcmp(name,"__VA_ARGS__");
  if ((iVar1 == 0 && sVar2 != 0) && (ptVar3 = VARR_token_tlast(params), *(short *)ptVar3 == 0x10f))
  {
    return (int)sVar2 + -1;
  }
  ix = 0;
  while( true ) {
    if (sVar2 == ix) {
      return -1;
    }
    ptVar3 = VARR_token_tget(params,ix);
    iVar1 = strcmp(ptVar3->repr,name);
    if (iVar1 == 0) break;
    ix = ix + 1;
  }
  return (int)ix;
}

Assistant:

static int find_param (VARR (token_t) * params, const char *name) {
  size_t len = VARR_LENGTH (token_t, params);
  token_t param;

  if (strcmp (name, varg) == 0 && len != 0 && VARR_LAST (token_t, params)->code == T_DOTS)
    return (int) len - 1;
  for (size_t i = 0; i < len; i++) {
    param = VARR_GET (token_t, params, i);
    if (strcmp (param->repr, name) == 0) return (int) i;
  }
  return -1;
}